

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

SourceLibrary * __thiscall
slang::ast::Compilation::getSourceLibrary(Compilation *this,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  uint64_t uVar12;
  byte bVar13;
  value_type_pointer __y;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->libraryNameMap,&local_40);
  uVar15 = uVar12 >> ((byte)(this->libraryNameMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar16 = (uVar12 & 0xff) * 4;
  uVar6 = (&UNK_007e24cc)[lVar16];
  uVar7 = (&UNK_007e24cd)[lVar16];
  uVar8 = (&UNK_007e24ce)[lVar16];
  bVar9 = (&UNK_007e24cf)[lVar16];
  uVar14 = 0;
  do {
    pgVar2 = (this->libraryNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar15;
    bVar13 = pgVar1->m[0xf].n;
    auVar17[0] = -(pgVar1->m[0].n == uVar6);
    auVar17[1] = -(pgVar1->m[1].n == uVar7);
    auVar17[2] = -(pgVar1->m[2].n == uVar8);
    auVar17[3] = -(pgVar1->m[3].n == bVar9);
    auVar17[4] = -(pgVar1->m[4].n == uVar6);
    auVar17[5] = -(pgVar1->m[5].n == uVar7);
    auVar17[6] = -(pgVar1->m[6].n == uVar8);
    auVar17[7] = -(pgVar1->m[7].n == bVar9);
    auVar17[8] = -(pgVar1->m[8].n == uVar6);
    auVar17[9] = -(pgVar1->m[9].n == uVar7);
    auVar17[10] = -(pgVar1->m[10].n == uVar8);
    auVar17[0xb] = -(pgVar1->m[0xb].n == bVar9);
    auVar17[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar17[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar17[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar17[0xf] = -(bVar13 == bVar9);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar11 != 0) {
      ppVar3 = (this->libraryNameMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
               .arrays.elements_;
      do {
        uVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __y = ppVar3 + uVar15 * 0xf + (ulong)uVar5;
        bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &this->libraryNameMap,&local_40,&__y->first);
        if (bVar10) {
          return __y->second;
        }
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar13 = pgVar2[uVar15].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar13) == 0) {
      return (SourceLibrary *)0x0;
    }
    uVar4 = (this->libraryNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
            .arrays.groups_size_mask;
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  return (SourceLibrary *)0x0;
}

Assistant:

const SourceLibrary* Compilation::getSourceLibrary(std::string_view name) const {
    if (auto it = libraryNameMap.find(name); it != libraryNameMap.end())
        return it->second;
    return nullptr;
}